

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderScalarN
               (char *label,ImGuiDataType data_type,void *v,int components,void *v_min,void *v_max,
               char *format,float power)

{
  bool bVar1;
  
  if ((power == 1.0) && (!NAN(power))) {
    bVar1 = SliderScalarN(label,data_type,v,components,v_min,v_max,format,0);
    return bVar1;
  }
  __assert_fail("power == 1.0f && \"Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old \'float power\' function!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                ,0xc6f,
                "bool ImGui::SliderScalarN(const char *, ImGuiDataType, void *, int, const void *, const void *, const char *, float)"
               );
}

Assistant:

bool ImGui::SliderScalarN(const char* label, ImGuiDataType data_type, void* v, int components, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiSliderFlags slider_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        slider_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return SliderScalarN(label, data_type, v, components, v_min, v_max, format, slider_flags);
}